

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Mat *this_01;
  Mat *this_02;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  void *pvVar13;
  uint uVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  float *ptr1_7;
  ulong uVar19;
  void *pvVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  void *pvVar27;
  float *ptr_7;
  void *pvVar28;
  float fVar29;
  float fVar30;
  ulong local_e0;
  ulong local_d0;
  void *local_b8;
  void *local_b0;
  void *local_98;
  void *local_90;
  Mat local_88;
  void *local_40;
  long local_38;
  
  if (8 < (uint)this->op_type) {
    return 0;
  }
  this_01 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = this_01 + 1;
  this_02 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(this->op_type) {
  case 0:
    uVar12 = this_01->w;
    lVar16 = (long)(int)uVar12;
    uVar17 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar26 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar18 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 == 1) {
      if (uVar12 == 1) {
        iVar23 = this_01[1].dims;
        if (iVar23 == 1) {
          Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar22 < 1) {
            return 0;
          }
          fVar29 = *this_01->data;
          pvVar15 = this_00->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) + fVar29
            ;
            uVar21 = uVar21 + 1;
          } while (uVar24 != uVar21);
          return 0;
        }
        if (iVar23 == 2) {
          Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar11 < 1) {
            return 0;
          }
          fVar29 = *this_01->data;
          pvVar15 = this_00->data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) + fVar29
            ;
            uVar21 = uVar21 + 1;
          } while (uVar11 != uVar21);
          return 0;
        }
        if (iVar23 == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          fVar29 = *this_01->data;
          pvVar15 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + uVar18 * 4) + fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
      }
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        iVar23 = -100;
        if ((pvVar13 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) {
          if (this_01[1].w == 1) {
            iVar23 = 0;
            if (0 < (int)uVar12) {
              fVar29 = *this_00->data;
              pvVar15 = this_01->data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar13 + uVar21 * 4) =
                     *(float *)((long)pvVar15 + uVar21 * 4) + fVar29;
                uVar21 = uVar21 + 1;
              } while (uVar17 != uVar21);
              iVar23 = 0;
            }
          }
          else {
            iVar23 = 0;
            if (0 < (int)uVar12) {
              pvVar15 = this_01->data;
              pvVar20 = this_01[1].data;
              uVar21 = 0;
              do {
                *(float *)((long)pvVar13 + uVar21 * 4) =
                     *(float *)((long)pvVar20 + uVar21 * 4) + *(float *)((long)pvVar15 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar17 != uVar21);
              iVar23 = 0;
            }
          }
        }
      }
      else if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        iVar23 = -100;
        if (((pvVar13 != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
           (iVar23 = 0, 0 < (int)uVar1)) {
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          iVar23 = 0;
          do {
            if (0 < (int)uVar22) {
              fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar20 + uVar17 * 4) + fVar29;
                uVar17 = uVar17 + 1;
              } while (uVar24 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
            pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
          } while (uVar21 != uVar18);
        }
      }
      else if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        iVar23 = -100;
        if (((pvVar13 != (void *)0x0) && (sVar5 = this_02->cstep, (long)this_02->c * sVar5 != 0)) &&
           (iVar23 = 0, 0 < (int)uVar2)) {
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          iVar23 = 0;
          do {
            if (0 < (int)uVar11) {
              fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar20 + uVar18 * 4) + fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
        }
      }
      else {
        iVar23 = 0;
      }
      return iVar23;
    }
    uVar3 = this_01->h;
    uVar19 = (ulong)uVar3;
    uVar14 = uVar3 * uVar12;
    if (iVar23 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        iVar23 = this_01->w;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01[1].cstep;
        pvVar20 = this_01[1].data;
        uVar17 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar19 = 0;
            pvVar27 = pvVar20;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar22) {
                fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                uVar25 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar25 * 4) =
                       *(float *)((long)pvVar27 + uVar25 * 4) + fVar29;
                  uVar25 = uVar25 + 1;
                } while (uVar24 != uVar25);
              }
              uVar19 = uVar19 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
            } while (uVar19 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
        } while (uVar17 != uVar21);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) =
               *(float *)((long)pvVar20 + uVar21 * 4) + *(float *)((long)pvVar15 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar12) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) + fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
        } while (uVar21 != uVar19);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar15 = this_01->data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) + fVar29;
        uVar21 = uVar21 + 1;
      } while (uVar14 != uVar21);
      return 0;
    }
    if (iVar23 != 3) {
      return 0;
    }
    uVar4 = this_01->c;
    uVar25 = (ulong)uVar4;
    if (this_01[1].dims == 3) {
      if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01->cstep;
        sVar9 = this_01[1].cstep;
        sVar10 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21) +
                   *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar20 + uVar17 * 4) + *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01->cstep;
        sVar9 = this_01[1].cstep;
        sVar10 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar20 + uVar18 * 4) +
                   *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
        } while (uVar17 != uVar21);
        return 0;
      }
      if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar20 + uVar18 * 4) + *(float *)((long)pvVar15 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01[1].cstep;
        sVar9 = this_02->elemsize;
        sVar10 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar18 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar24 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                uVar25 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar25 * 4) =
                       *(float *)((long)pvVar27 + uVar25 * 4) + fVar29;
                  uVar25 = uVar25 + 1;
                } while (uVar17 != uVar25);
              }
              uVar24 = uVar24 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar24 != uVar19);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
        } while (uVar18 != uVar21);
        return 0;
      }
      if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01[1].cstep;
        sVar9 = this_02->elemsize;
        sVar10 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar18 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar22 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar24 * 4) =
                       *(float *)((long)pvVar20 + uVar24 * 4) +
                       *(float *)((long)pvVar27 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar22 != uVar3);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
        } while (uVar18 != uVar21);
        return 0;
      }
      if ((((uVar12 == 1) && (uVar22 != 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01->cstep;
        sVar9 = this_02->elemsize;
        sVar10 = this_01[1].cstep;
        pvVar20 = this_01[1].data;
        uVar17 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar19 = 0;
            pvVar27 = pvVar20;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar22) {
                fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                uVar25 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar25 * 4) =
                       *(float *)((long)pvVar27 + uVar25 * 4) + fVar29;
                  uVar25 = uVar25 + 1;
                } while (uVar24 != uVar25);
              }
              uVar19 = uVar19 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
            } while (uVar19 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
        } while (uVar17 != uVar21);
        return 0;
      }
      if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar14) {
            uVar21 = 0;
            do {
              *(float *)((long)pvVar20 + uVar21 * 4) =
                   *(float *)((long)pvVar15 + uVar21 * 4) + *(float *)((long)pvVar13 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar4);
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar2 < 1) {
        return 0;
      }
      uVar12 = 0;
      do {
        Mat::channel(&local_88,this_01,uVar12);
        pvVar13 = local_88.data;
        Mat::~Mat(&local_88);
        Mat::channel(&local_88,this_00,uVar12);
        pvVar15 = local_88.data;
        Mat::~Mat(&local_88);
        Mat::channel(&local_88,this_02,uVar12);
        pvVar20 = local_88.data;
        Mat::~Mat(&local_88);
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            if (0 < (int)uVar22) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar20 + uVar21 * 4) =
                     *(float *)((long)pvVar15 + uVar21 * 4) + *(float *)((long)pvVar13 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar24 != uVar21);
            }
            uVar11 = uVar11 + 1;
            pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
          } while (uVar11 != uVar1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2);
      return 0;
    }
    Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar5 = this_02->cstep;
    if ((long)this_02->c * sVar5 == 0) {
      return -100;
    }
    if (this_01[1].dims != 1) {
      if (this_01[1].dims != 2) {
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      iVar23 = this_01[1].w;
      sVar7 = this_01[1].elemsize;
      sVar8 = this_02->elemsize;
      sVar9 = this_01->cstep;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar18 = 0;
          pvVar27 = pvVar15;
          pvVar28 = pvVar13;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar28 + uVar24 * 4) =
                     *(float *)((long)pvVar27 + uVar24 * 4) + fVar29;
                uVar24 = uVar24 + 1;
              } while (uVar17 != uVar24);
            }
            uVar18 = uVar18 + 1;
            pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
            pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
          } while (uVar18 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      pvVar20 = this_01[1].data;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) + fVar29
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if ((int)uVar4 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    sVar6 = this_01->elemsize;
    sVar7 = this_01->cstep;
    sVar8 = this_02->elemsize;
    uVar21 = 0;
    do {
      if (0 < (int)uVar14) {
        uVar17 = 0;
        do {
          *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) + fVar29;
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
      }
      uVar21 = uVar21 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
      pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
    } while (uVar21 != uVar25);
    return 0;
  case 2:
    uVar12 = this_01->w;
    lVar16 = (long)(int)uVar12;
    uVar17 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar26 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar18 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 != 1) {
      uVar3 = this_01->h;
      uVar19 = (ulong)uVar3;
      uVar14 = uVar3 * uVar12;
      if (iVar23 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          iVar23 = this_01->w;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_02->elemsize;
          sVar9 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) * fVar29;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar13 + uVar21 * 4) =
                 *(float *)((long)pvVar20 + uVar21 * 4) * *(float *)((long)pvVar15 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w != 1) {
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + uVar18 * 4) * fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
          } while (uVar21 != uVar19);
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar29 = *this_00->data;
        pvVar15 = this_01->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) * fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      uVar4 = this_01->c;
      uVar25 = (ulong)uVar4;
      if (this_01[1].dims == 3) {
        if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21) *
                     *(float *)((long)pvVar15 + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01->cstep;
          sVar8 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar20 + uVar17 * 4) * *(float *)((long)pvVar15 + uVar17 * 4)
                ;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar20 + uVar18 * 4) *
                     *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17);
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar20 + uVar18 * 4) * *(float *)((long)pvVar15 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar24 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) * fVar29;
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
                uVar24 = uVar24 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar24 != uVar19);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar22 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar24 * 4) =
                         *(float *)((long)pvVar20 + uVar24 * 4) *
                         *(float *)((long)pvVar27 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar17 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar22 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar12 == 1) && (uVar22 != 1)) && ((uVar1 == uVar3 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) * fVar29;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar12 = 0;
          do {
            Mat::channel(&local_88,this_01,uVar12);
            pvVar13 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_00,uVar12);
            pvVar15 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar12);
            pvVar20 = local_88.data;
            Mat::~Mat(&local_88);
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar20 + uVar21 * 4) =
                     *(float *)((long)pvVar15 + uVar21 * 4) * *(float *)((long)pvVar13 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
          return 0;
        }
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar20 + uVar21 * 4) =
                       *(float *)((long)pvVar15 + uVar21 * 4) *
                       *(float *)((long)pvVar13 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              uVar11 = uVar11 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
            } while (uVar11 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        iVar23 = this_01[1].w;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar24 * 4) =
                       *(float *)((long)pvVar27 + uVar24 * 4) * fVar29;
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar18 = uVar18 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar18 != uVar19);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
        } while (uVar21 != uVar25);
        return 0;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) * fVar29;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) * fVar29
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (uVar12 == 1) {
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) * fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        return 0;
      }
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) * fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
        return 0;
      }
      if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) * fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
    }
    iVar23 = this_01[1].dims;
    if (iVar23 != 1) {
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar22) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar20 + uVar17 * 4) * fVar29;
              uVar17 = uVar17 + 1;
            } while (uVar24 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
        } while (uVar21 != uVar18);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 != (void *)0x0) {
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar20 + uVar18 * 4) * fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      return -100;
    }
    Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) =
             *(float *)((long)pvVar20 + uVar21 * 4) * *(float *)((long)pvVar15 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
      return 0;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    uVar21 = 0;
    do {
      *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) * fVar29;
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    return 0;
  case 3:
    uVar12 = this_01->w;
    lVar26 = (long)(int)uVar12;
    uVar17 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar16 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar18 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 != 1) {
      uVar3 = this_01->h;
      uVar19 = (ulong)uVar3;
      uVar14 = uVar3 * uVar12;
      if (iVar23 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          iVar23 = this_01->w;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_02->elemsize;
          sVar9 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         fVar29 / *(float *)((long)pvVar27 + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar13 + uVar21 * 4) =
                 *(float *)((long)pvVar15 + uVar21 * 4) / *(float *)((long)pvVar20 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w != 1) {
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + uVar18 * 4) * (1.0 / fVar29);
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
          } while (uVar21 != uVar19);
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        fVar29 = *this_01[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) =
               *(float *)((long)pvVar15 + uVar21 * 4) * (1.0 / fVar29);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      uVar4 = this_01->c;
      uVar25 = (ulong)uVar4;
      if (this_01[1].dims == 3) {
        if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar15 + uVar17 * 4) /
                     *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21);
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01->cstep;
          sVar8 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar15 + uVar17 * 4) / *(float *)((long)pvVar20 + uVar17 * 4)
                ;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17) /
                     *(float *)((long)pvVar20 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar15 + uVar18 * 4) / *(float *)((long)pvVar20 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar24 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) * (1.0 / fVar29);
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
                uVar24 = uVar24 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar24 != uVar19);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar22 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar24 * 4) =
                         *(float *)((long)pvVar27 + uVar24 * 4) /
                         *(float *)((long)pvVar20 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar17 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar22 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if ((((uVar12 == 1) && (uVar22 != 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         fVar29 / *(float *)((long)pvVar27 + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar12 = 0;
          do {
            Mat::channel(&local_88,this_01,uVar12);
            pvVar13 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_00,uVar12);
            pvVar15 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar12);
            pvVar20 = local_88.data;
            Mat::~Mat(&local_88);
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar20 + uVar21 * 4) =
                     *(float *)((long)pvVar13 + uVar21 * 4) / *(float *)((long)pvVar15 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
          return 0;
        }
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar20 + uVar21 * 4) =
                       *(float *)((long)pvVar13 + uVar21 * 4) /
                       *(float *)((long)pvVar15 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              uVar11 = uVar11 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar16 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
            } while (uVar11 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        iVar23 = this_01[1].w;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01->cstep;
        uVar21 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar24 * 4) =
                       *(float *)((long)pvVar27 + uVar24 * 4) * (1.0 / fVar29);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar18 = uVar18 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
            } while (uVar18 != uVar19);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
        } while (uVar21 != uVar25);
        return 0;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) * (1.0 / fVar29);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      sVar6 = this_01->elemsize;
      sVar7 = this_01->cstep;
      pvVar15 = this_01->data;
      sVar8 = this_02->elemsize;
      fVar29 = *this_01[1].data;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 *(float *)((long)pvVar15 + uVar17 * 4) * (1.0 / fVar29);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (uVar12 == 1) {
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 / *(float *)((long)pvVar15 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        return 0;
      }
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 / *(float *)((long)pvVar15 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
        return 0;
      }
      if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   fVar29 / *(float *)((long)pvVar15 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
    }
    iVar23 = this_01[1].dims;
    if (iVar23 != 1) {
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar22) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   fVar29 / *(float *)((long)pvVar20 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar24 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar16 * 4);
        } while (uVar21 != uVar18);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 != (void *)0x0) {
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   fVar29 / *(float *)((long)pvVar20 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      return -100;
    }
    Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) =
             *(float *)((long)pvVar15 + uVar21 * 4) / *(float *)((long)pvVar20 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
      return 0;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    pvVar15 = this_01->data;
    fVar29 = *this_01[1].data;
    uVar21 = 0;
    do {
      *(float *)((long)pvVar13 + uVar21 * 4) =
           *(float *)((long)pvVar15 + uVar21 * 4) * (1.0 / fVar29);
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    return 0;
  case 4:
    uVar12 = this_01->w;
    lVar16 = (long)(int)uVar12;
    uVar17 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar26 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar18 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 != 1) {
      uVar3 = this_01->h;
      uVar19 = (ulong)uVar3;
      uVar14 = uVar3 * uVar12;
      if (iVar23 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          iVar23 = this_01->w;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_02->elemsize;
          sVar9 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                  uVar25 = 0;
                  do {
                    fVar30 = *(float *)((long)pvVar27 + uVar25 * 4);
                    if (fVar30 <= fVar29) {
                      fVar30 = fVar29;
                    }
                    *(float *)((long)pvVar28 + uVar25 * 4) = fVar30;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
            if (fVar29 <= fVar30) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar13 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w != 1) {
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
              uVar18 = 0;
              do {
                fVar30 = *(float *)((long)pvVar15 + uVar18 * 4);
                if (fVar30 <= fVar29) {
                  fVar30 = fVar29;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
          } while (uVar21 != uVar19);
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar29 = *this_00->data;
        pvVar15 = this_01->data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
          if (fVar30 <= fVar29) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      uVar4 = this_01->c;
      uVar25 = (ulong)uVar4;
      if (this_01[1].dims == 3) {
        if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21);
                fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
                if (fVar29 <= fVar30) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar29;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01->cstep;
          sVar8 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + uVar17 * 4);
                fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
                if (fVar29 <= fVar30) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar29;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4);
                fVar30 = *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17);
                if (fVar29 <= fVar30) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4);
                fVar30 = *(float *)((long)pvVar15 + uVar18 * 4);
                if (fVar29 <= fVar30) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar24 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                  uVar25 = 0;
                  do {
                    fVar30 = *(float *)((long)pvVar27 + uVar25 * 4);
                    if (fVar30 <= fVar29) {
                      fVar30 = fVar29;
                    }
                    *(float *)((long)pvVar28 + uVar25 * 4) = fVar30;
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
                uVar24 = uVar24 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar24 != uVar19);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar22 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  uVar24 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar20 + uVar24 * 4);
                    fVar30 = *(float *)((long)pvVar27 + uVar24 * 4);
                    if (fVar29 <= fVar30) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar28 + uVar24 * 4) = fVar29;
                    uVar24 = uVar24 + 1;
                  } while (uVar17 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar22 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar12 == 1) && (uVar22 != 1)) && ((uVar1 == uVar3 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                  uVar25 = 0;
                  do {
                    fVar30 = *(float *)((long)pvVar27 + uVar25 * 4);
                    if (fVar30 <= fVar29) {
                      fVar30 = fVar29;
                    }
                    *(float *)((long)pvVar28 + uVar25 * 4) = fVar30;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar12 = 0;
          do {
            Mat::channel(&local_88,this_01,uVar12);
            pvVar13 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_00,uVar12);
            pvVar15 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar12);
            pvVar20 = local_88.data;
            Mat::~Mat(&local_88);
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
                fVar30 = *(float *)((long)pvVar13 + uVar21 * 4);
                if (fVar29 <= fVar30) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar20 + uVar21 * 4) = fVar29;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
          return 0;
        }
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
                  fVar30 = *(float *)((long)pvVar13 + uVar21 * 4);
                  if (fVar29 <= fVar30) {
                    fVar29 = fVar30;
                  }
                  *(float *)((long)pvVar20 + uVar21 * 4) = fVar29;
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              uVar11 = uVar11 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
            } while (uVar11 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        iVar23 = this_01[1].w;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
                uVar24 = 0;
                do {
                  fVar30 = *(float *)((long)pvVar27 + uVar24 * 4);
                  if (fVar30 <= fVar29) {
                    fVar30 = fVar29;
                  }
                  *(float *)((long)pvVar28 + uVar24 * 4) = fVar30;
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar18 = uVar18 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar18 != uVar19);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
        } while (uVar21 != uVar25);
        return 0;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar17 = 0;
            do {
              fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
              if (fVar30 <= fVar29) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar30;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
            if (fVar30 <= fVar29) {
              fVar30 = fVar29;
            }
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar30;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (uVar12 == 1) {
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
          if (fVar30 <= fVar29) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        return 0;
      }
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
          if (fVar30 <= fVar29) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
        return 0;
      }
      if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              fVar30 = *(float *)((long)pvVar15 + uVar18 * 4);
              if (fVar30 <= fVar29) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
    }
    iVar23 = this_01[1].dims;
    if (iVar23 != 1) {
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar22) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar17 = 0;
            do {
              fVar30 = *(float *)((long)pvVar20 + uVar17 * 4);
              if (fVar30 <= fVar29) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar30;
              uVar17 = uVar17 + 1;
            } while (uVar24 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
        } while (uVar21 != uVar18);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 != (void *)0x0) {
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              fVar30 = *(float *)((long)pvVar20 + uVar18 * 4);
              if (fVar30 <= fVar29) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      return -100;
    }
    Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
        fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
        if (fVar29 <= fVar30) {
          fVar29 = fVar30;
        }
        *(float *)((long)pvVar13 + uVar21 * 4) = fVar29;
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
      return 0;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    uVar21 = 0;
    do {
      fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
      if (fVar30 <= fVar29) {
        fVar30 = fVar29;
      }
      *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    return 0;
  case 5:
    uVar12 = this_01->w;
    lVar16 = (long)(int)uVar12;
    uVar17 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar26 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar18 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 != 1) {
      uVar3 = this_01->h;
      uVar19 = (ulong)uVar3;
      uVar14 = uVar3 * uVar12;
      if (iVar23 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          iVar23 = this_01->w;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_02->elemsize;
          sVar9 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                  uVar25 = 0;
                  do {
                    fVar30 = *(float *)((long)pvVar27 + uVar25 * 4);
                    if (fVar29 <= fVar30) {
                      fVar30 = fVar29;
                    }
                    *(float *)((long)pvVar28 + uVar25 * 4) = fVar30;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
            if (fVar30 <= fVar29) {
              fVar29 = fVar30;
            }
            *(float *)((long)pvVar13 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w != 1) {
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
              uVar18 = 0;
              do {
                fVar30 = *(float *)((long)pvVar15 + uVar18 * 4);
                if (fVar29 <= fVar30) {
                  fVar30 = fVar29;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
          } while (uVar21 != uVar19);
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar29 = *this_00->data;
        pvVar15 = this_01->data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
          if (fVar29 <= fVar30) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      uVar4 = this_01->c;
      uVar25 = (ulong)uVar4;
      if (this_01[1].dims == 3) {
        if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21);
                fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
                if (fVar30 <= fVar29) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar29;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01->cstep;
          sVar8 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + uVar17 * 4);
                fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
                if (fVar30 <= fVar29) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar29;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4);
                fVar30 = *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17);
                if (fVar30 <= fVar29) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4);
                fVar30 = *(float *)((long)pvVar15 + uVar18 * 4);
                if (fVar30 <= fVar29) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar24 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                  uVar25 = 0;
                  do {
                    fVar30 = *(float *)((long)pvVar27 + uVar25 * 4);
                    if (fVar29 <= fVar30) {
                      fVar30 = fVar29;
                    }
                    *(float *)((long)pvVar28 + uVar25 * 4) = fVar30;
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
                uVar24 = uVar24 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar24 != uVar19);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar22 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  uVar24 = 0;
                  do {
                    fVar29 = *(float *)((long)pvVar20 + uVar24 * 4);
                    fVar30 = *(float *)((long)pvVar27 + uVar24 * 4);
                    if (fVar30 <= fVar29) {
                      fVar29 = fVar30;
                    }
                    *(float *)((long)pvVar28 + uVar24 * 4) = fVar29;
                    uVar24 = uVar24 + 1;
                  } while (uVar17 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar22 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if ((((uVar12 == 1) && (uVar22 != 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                  uVar25 = 0;
                  do {
                    fVar30 = *(float *)((long)pvVar27 + uVar25 * 4);
                    if (fVar29 <= fVar30) {
                      fVar30 = fVar29;
                    }
                    *(float *)((long)pvVar28 + uVar25 * 4) = fVar30;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar12 = 0;
          do {
            Mat::channel(&local_88,this_01,uVar12);
            pvVar13 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_00,uVar12);
            pvVar15 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar12);
            pvVar20 = local_88.data;
            Mat::~Mat(&local_88);
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
                fVar30 = *(float *)((long)pvVar13 + uVar21 * 4);
                if (fVar30 <= fVar29) {
                  fVar29 = fVar30;
                }
                *(float *)((long)pvVar20 + uVar21 * 4) = fVar29;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
          return 0;
        }
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
                  fVar30 = *(float *)((long)pvVar13 + uVar21 * 4);
                  if (fVar30 <= fVar29) {
                    fVar29 = fVar30;
                  }
                  *(float *)((long)pvVar20 + uVar21 * 4) = fVar29;
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              uVar11 = uVar11 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
            } while (uVar11 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        iVar23 = this_01[1].w;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
                uVar24 = 0;
                do {
                  fVar30 = *(float *)((long)pvVar27 + uVar24 * 4);
                  if (fVar29 <= fVar30) {
                    fVar30 = fVar29;
                  }
                  *(float *)((long)pvVar28 + uVar24 * 4) = fVar30;
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar18 = uVar18 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar18 != uVar19);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
        } while (uVar21 != uVar25);
        return 0;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar17 = 0;
            do {
              fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
              if (fVar29 <= fVar30) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar30;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar30 = *(float *)((long)pvVar15 + uVar17 * 4);
            if (fVar29 <= fVar30) {
              fVar30 = fVar29;
            }
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar30;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (uVar12 == 1) {
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
          if (fVar29 <= fVar30) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        return 0;
      }
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
          if (fVar29 <= fVar30) {
            fVar30 = fVar29;
          }
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
        return 0;
      }
      if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              fVar30 = *(float *)((long)pvVar15 + uVar18 * 4);
              if (fVar29 <= fVar30) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
    }
    iVar23 = this_01[1].dims;
    if (iVar23 != 1) {
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar22) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar17 = 0;
            do {
              fVar30 = *(float *)((long)pvVar20 + uVar17 * 4);
              if (fVar29 <= fVar30) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar17 * 4) = fVar30;
              uVar17 = uVar17 + 1;
            } while (uVar24 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
        } while (uVar21 != uVar18);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 != (void *)0x0) {
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              fVar30 = *(float *)((long)pvVar20 + uVar18 * 4);
              if (fVar29 <= fVar30) {
                fVar30 = fVar29;
              }
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      return -100;
    }
    Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
        fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
        if (fVar30 <= fVar29) {
          fVar29 = fVar30;
        }
        *(float *)((long)pvVar13 + uVar21 * 4) = fVar29;
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
      return 0;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    uVar21 = 0;
    do {
      fVar30 = *(float *)((long)pvVar15 + uVar21 * 4);
      if (fVar29 <= fVar30) {
        fVar30 = fVar29;
      }
      *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    return 0;
  case 6:
    uVar12 = this_01->w;
    lVar26 = (long)(int)uVar12;
    uVar18 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar16 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar17 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 != 1) {
      uVar3 = this_01->h;
      uVar19 = (ulong)uVar3;
      uVar14 = uVar3 * uVar12;
      if (iVar23 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          local_98 = this_02->data;
          if (local_98 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          local_40 = this_01->data;
          local_38 = (long)this_01->w * this_01->elemsize;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_02->elemsize;
          sVar8 = this_01[1].cstep;
          local_b8 = this_01[1].data;
          local_b0 = (void *)0x0;
          do {
            pvVar13 = local_40;
            if (0 < (int)uVar1) {
              lVar26 = local_38 * (long)local_b0;
              uVar18 = 0;
              pvVar15 = local_b8;
              pvVar20 = local_98;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar13 + uVar18 * 4 + lVar26);
                  uVar19 = 0;
                  do {
                    fVar30 = powf(fVar29,*(float *)((long)pvVar15 + uVar19 * 4));
                    *(float *)((long)pvVar20 + uVar19 * 4) = fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar18 = uVar18 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar16 * 4);
                pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
              } while (uVar18 != uVar17);
            }
            local_b0 = (void *)((long)local_b0 + 1);
            local_98 = (void *)((long)local_98 + sVar5 * sVar7);
            local_b8 = (void *)((long)local_b8 + sVar6 * sVar8);
          } while (local_b0 != (void *)uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            fVar29 = powf(*(float *)((long)pvVar15 + uVar21 * 4),
                          *(float *)((long)pvVar20 + uVar21 * 4));
            *(float *)((long)pvVar13 + uVar21 * 4) = fVar29;
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w != 1) {
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
              uVar17 = 0;
              do {
                fVar30 = powf(*(float *)((long)pvVar15 + uVar17 * 4),fVar29);
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar30;
                uVar17 = uVar17 + 1;
              } while (uVar18 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
          } while (uVar21 != uVar19);
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar29 = *this_00->data;
        pvVar15 = this_01->data;
        uVar21 = 0;
        do {
          fVar30 = powf(*(float *)((long)pvVar15 + uVar21 * 4),fVar29);
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      uVar4 = this_01->c;
      uVar25 = (ulong)uVar4;
      if (this_01[1].dims == 3) {
        if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          local_e0 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                fVar29 = powf(*(float *)((long)pvVar15 + uVar21 * 4),
                              *(float *)((long)pvVar20 + sVar7 * sVar9 * local_e0));
                *(float *)((long)pvVar13 + uVar21 * 4) = fVar29;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            local_e0 = local_e0 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
          } while (local_e0 != uVar25);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01->cstep;
          sVar8 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                fVar29 = powf(*(float *)((long)pvVar15 + uVar17 * 4),
                              *(float *)((long)pvVar20 + uVar17 * 4));
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar29;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          local_e0 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar17 = 0;
              do {
                fVar29 = powf(*(float *)((long)pvVar15 + sVar6 * sVar8 * local_e0),
                              *(float *)((long)pvVar20 + uVar17 * 4));
                *(float *)((long)pvVar13 + uVar17 * 4) = fVar29;
                uVar17 = uVar17 + 1;
              } while (uVar11 != uVar17);
            }
            local_e0 = local_e0 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (local_e0 != uVar21);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                fVar29 = powf(*(float *)((long)pvVar15 + uVar18 * 4),
                              *(float *)((long)pvVar20 + uVar18 * 4));
                *(float *)((long)pvVar13 + uVar18 * 4) = fVar29;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          local_b0 = this_02->data;
          if (local_b0 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          local_98 = this_01->data;
          sVar6 = this_01->elemsize;
          local_40 = (void *)(this_01[1].elemsize * this_01[1].cstep);
          sVar7 = this_02->elemsize;
          sVar8 = this_01->cstep;
          pvVar13 = this_01[1].data;
          local_b8 = (void *)0x0;
          do {
            if (0 < (int)uVar3) {
              lVar16 = (long)local_40 * (long)local_b8;
              uVar17 = 0;
              pvVar15 = local_b0;
              pvVar20 = local_98;
              do {
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar13 + uVar17 * 4 + lVar16);
                  uVar24 = 0;
                  do {
                    fVar30 = powf(*(float *)((long)pvVar20 + uVar24 * 4),fVar29);
                    *(float *)((long)pvVar15 + uVar24 * 4) = fVar30;
                    uVar24 = uVar24 + 1;
                  } while (uVar18 != uVar24);
                }
                uVar17 = uVar17 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
                pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
              } while (uVar17 != uVar19);
            }
            local_b8 = (void *)((long)local_b8 + 1);
            local_b0 = (void *)((long)local_b0 + sVar5 * sVar7);
            local_98 = (void *)((long)local_98 + sVar6 * sVar8);
          } while (local_b8 != (void *)uVar21);
          return 0;
        }
        if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          local_b8 = this_02->data;
          if (local_b8 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          local_b0 = this_01->data;
          sVar6 = this_01->elemsize;
          local_40 = (void *)(this_01[1].elemsize * this_01[1].cstep);
          sVar7 = this_02->elemsize;
          sVar8 = this_01->cstep;
          pvVar13 = this_01[1].data;
          local_d0 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar22 = 0;
              pvVar15 = local_b0;
              pvVar20 = local_b8;
              do {
                if (0 < (int)uVar12) {
                  uVar17 = 0;
                  do {
                    fVar29 = powf(*(float *)((long)pvVar15 + uVar17 * 4),
                                  *(float *)((long)pvVar13 + uVar17 * 4));
                    *(float *)((long)pvVar20 + uVar17 * 4) = fVar29;
                    uVar17 = uVar17 + 1;
                  } while (uVar18 != uVar17);
                }
                uVar22 = uVar22 + 1;
                pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
                pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
              } while (uVar22 != uVar3);
            }
            local_d0 = local_d0 + 1;
            local_b8 = (void *)((long)local_b8 + sVar5 * sVar7);
            pvVar13 = (void *)((long)pvVar13 + (long)local_40);
            local_b0 = (void *)((long)local_b0 + sVar6 * sVar8);
          } while (local_d0 != uVar21);
          return 0;
        }
        if ((((uVar12 == 1) && (uVar22 != 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          local_98 = this_02->data;
          if (local_98 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          local_40 = this_01->data;
          sVar6 = this_01[1].elemsize;
          local_38 = this_01->elemsize * this_01->cstep;
          sVar7 = this_02->elemsize;
          sVar8 = this_01[1].cstep;
          local_b8 = this_01[1].data;
          local_b0 = (void *)0x0;
          do {
            pvVar13 = local_40;
            if (0 < (int)uVar1) {
              lVar26 = local_38 * (long)local_b0;
              uVar18 = 0;
              pvVar15 = local_98;
              pvVar20 = local_b8;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar13 + uVar18 * 4 + lVar26);
                  uVar19 = 0;
                  do {
                    fVar30 = powf(fVar29,*(float *)((long)pvVar20 + uVar19 * 4));
                    *(float *)((long)pvVar15 + uVar19 * 4) = fVar30;
                    uVar19 = uVar19 + 1;
                  } while (uVar24 != uVar19);
                }
                uVar18 = uVar18 + 1;
                pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
                pvVar20 = (void *)((long)pvVar20 + lVar16 * 4);
              } while (uVar18 != uVar17);
            }
            local_b0 = (void *)((long)local_b0 + 1);
            local_98 = (void *)((long)local_98 + sVar5 * sVar7);
            local_b8 = (void *)((long)local_b8 + sVar6 * sVar8);
          } while (local_b0 != (void *)uVar21);
          return 0;
        }
        if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar12 = 0;
          do {
            Mat::channel(&local_88,this_01,uVar12);
            pvVar13 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_00,uVar12);
            pvVar15 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar12);
            pvVar20 = local_88.data;
            Mat::~Mat(&local_88);
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                fVar29 = powf(*(float *)((long)pvVar13 + uVar21 * 4),
                              *(float *)((long)pvVar15 + uVar21 * 4));
                *(float *)((long)pvVar20 + uVar21 * 4) = fVar29;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
          return 0;
        }
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  fVar29 = powf(*(float *)((long)pvVar13 + uVar21 * 4),
                                *(float *)((long)pvVar15 + uVar21 * 4));
                  *(float *)((long)pvVar20 + uVar21 * 4) = fVar29;
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              uVar11 = uVar11 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar16 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
            } while (uVar11 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
      local_b0 = this_02->data;
      if (local_b0 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        local_90 = this_01->data;
        sVar6 = this_01->elemsize;
        local_40 = (void *)((long)this_01[1].w * this_01[1].elemsize);
        sVar7 = this_02->elemsize;
        sVar8 = this_01->cstep;
        pvVar13 = this_01[1].data;
        local_b8 = (void *)0x0;
        do {
          if (0 < (int)uVar3) {
            lVar16 = (long)local_40 * (long)local_b8;
            uVar21 = 0;
            pvVar15 = local_b0;
            pvVar20 = local_90;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar13 + uVar21 * 4 + lVar16);
                uVar17 = 0;
                do {
                  fVar30 = powf(*(float *)((long)pvVar20 + uVar17 * 4),fVar29);
                  *(float *)((long)pvVar15 + uVar17 * 4) = fVar30;
                  uVar17 = uVar17 + 1;
                } while (uVar18 != uVar17);
              }
              uVar21 = uVar21 + 1;
              pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
              pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
            } while (uVar21 != uVar19);
          }
          local_b8 = (void *)((long)local_b8 + 1);
          local_b0 = (void *)((long)local_b0 + sVar5 * sVar7);
          local_90 = (void *)((long)local_90 + sVar6 * sVar8);
        } while (local_b8 != (void *)uVar25);
        return 0;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar13 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar15 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar17 = 0;
            do {
              fVar30 = powf(*(float *)((long)pvVar13 + uVar17 * 4),fVar29);
              *(float *)((long)local_b0 + uVar17 * 4) = fVar30;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          local_b0 = (void *)((long)local_b0 + sVar5 * sVar8);
          pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar13 = this_01->data;
      sVar6 = this_01->elemsize;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar30 = powf(*(float *)((long)pvVar13 + uVar17 * 4),fVar29);
            *(float *)((long)local_b0 + uVar17 * 4) = fVar30;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        local_b0 = (void *)((long)local_b0 + sVar5 * sVar8);
        pvVar13 = (void *)((long)pvVar13 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (uVar12 == 1) {
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          fVar30 = powf(fVar29,*(float *)((long)pvVar15 + uVar21 * 4));
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        return 0;
      }
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          fVar30 = powf(fVar29,*(float *)((long)pvVar15 + uVar21 * 4));
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
        return 0;
      }
      if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              fVar30 = powf(fVar29,*(float *)((long)pvVar15 + uVar18 * 4));
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
    }
    iVar23 = this_01[1].dims;
    if (iVar23 != 1) {
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar22) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar18 = 0;
            do {
              fVar30 = powf(fVar29,*(float *)((long)pvVar20 + uVar18 * 4));
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
              uVar18 = uVar18 + 1;
            } while (uVar24 != uVar18);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar16 * 4);
        } while (uVar21 != uVar17);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 != (void *)0x0) {
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              fVar30 = powf(fVar29,*(float *)((long)pvVar20 + uVar18 * 4));
              *(float *)((long)pvVar13 + uVar18 * 4) = fVar30;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      return -100;
    }
    Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        fVar29 = powf(*(float *)((long)pvVar15 + uVar21 * 4),*(float *)((long)pvVar20 + uVar21 * 4))
        ;
        *(float *)((long)pvVar13 + uVar21 * 4) = fVar29;
        uVar21 = uVar21 + 1;
      } while (uVar18 != uVar21);
      return 0;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    uVar21 = 0;
    do {
      fVar30 = powf(*(float *)((long)pvVar15 + uVar21 * 4),fVar29);
      *(float *)((long)pvVar13 + uVar21 * 4) = fVar30;
      uVar21 = uVar21 + 1;
    } while (uVar18 != uVar21);
    return 0;
  case 7:
    uVar12 = this_01->w;
    lVar16 = (long)(int)uVar12;
    uVar17 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar26 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar18 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 != 1) {
      uVar3 = this_01->h;
      uVar19 = (ulong)uVar3;
      uVar14 = uVar3 * uVar12;
      if (iVar23 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          iVar23 = this_01->w;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_02->elemsize;
          sVar9 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) - fVar29;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar13 + uVar21 * 4) =
                 *(float *)((long)pvVar20 + uVar21 * 4) - *(float *)((long)pvVar15 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w != 1) {
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     fVar29 - *(float *)((long)pvVar15 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
          } while (uVar21 != uVar19);
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar29 = *this_00->data;
        pvVar15 = this_01->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 - *(float *)((long)pvVar15 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      uVar4 = this_01->c;
      uVar25 = (ulong)uVar4;
      if (this_01[1].dims == 3) {
        if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21) -
                     *(float *)((long)pvVar15 + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01->cstep;
          sVar8 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar20 + uVar17 * 4) - *(float *)((long)pvVar15 + uVar17 * 4)
                ;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar20 + uVar18 * 4) -
                     *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17);
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar20 + uVar18 * 4) - *(float *)((long)pvVar15 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar24 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         fVar29 - *(float *)((long)pvVar27 + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
                uVar24 = uVar24 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar24 != uVar19);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar22 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar24 * 4) =
                         *(float *)((long)pvVar20 + uVar24 * 4) -
                         *(float *)((long)pvVar27 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar17 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar22 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if ((((uVar12 == 1) && (uVar22 != 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01[1].cstep;
          pvVar20 = this_01[1].data;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) - fVar29;
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar12 = 0;
          do {
            Mat::channel(&local_88,this_01,uVar12);
            pvVar13 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_00,uVar12);
            pvVar15 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar12);
            pvVar20 = local_88.data;
            Mat::~Mat(&local_88);
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar20 + uVar21 * 4) =
                     *(float *)((long)pvVar15 + uVar21 * 4) - *(float *)((long)pvVar13 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
          return 0;
        }
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar20 + uVar21 * 4) =
                       *(float *)((long)pvVar15 + uVar21 * 4) -
                       *(float *)((long)pvVar13 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              uVar11 = uVar11 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
            } while (uVar11 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        iVar23 = this_01[1].w;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar24 * 4) =
                       fVar29 - *(float *)((long)pvVar27 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar18 = uVar18 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar18 != uVar19);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
        } while (uVar21 != uVar25);
        return 0;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   fVar29 - *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar29 - *(float *)((long)pvVar15 + uVar17 * 4)
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (uVar12 == 1) {
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) - fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        return 0;
      }
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_00->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) - fVar29;
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
        return 0;
      }
      if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        fVar29 = *this_01->data;
        pvVar15 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) - fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
    }
    iVar23 = this_01[1].dims;
    if (iVar23 != 1) {
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar22) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar20 + uVar17 * 4) - fVar29;
              uVar17 = uVar17 + 1;
            } while (uVar24 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
        } while (uVar21 != uVar18);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 != (void *)0x0) {
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar20 + uVar18 * 4) - fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      return -100;
    }
    Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) =
             *(float *)((long)pvVar20 + uVar21 * 4) - *(float *)((long)pvVar15 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
      return 0;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    uVar21 = 0;
    do {
      *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 - *(float *)((long)pvVar15 + uVar21 * 4);
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    return 0;
  case 8:
    uVar12 = this_01->w;
    lVar16 = (long)(int)uVar12;
    uVar17 = (ulong)uVar12;
    sVar5 = this_01->elemsize;
    uVar22 = this_01[1].w;
    lVar26 = (long)(int)uVar22;
    uVar24 = (ulong)uVar22;
    uVar1 = this_01[1].h;
    uVar18 = (ulong)uVar1;
    uVar2 = this_01[1].c;
    uVar21 = (ulong)uVar2;
    uVar11 = uVar1 * uVar22;
    iVar23 = this_01->dims;
    if (iVar23 != 1) {
      uVar3 = this_01->h;
      uVar19 = (ulong)uVar3;
      uVar14 = uVar3 * uVar12;
      if (iVar23 == 2) {
        if (this_01[1].dims == 3) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          iVar23 = this_01->w;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_02->elemsize;
          sVar9 = this_01[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) * (1.0 / fVar29);
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].dims != 1) {
          if (this_01[1].dims != 2) {
            return 0;
          }
          if ((int)uVar14 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            *(float *)((long)pvVar13 + uVar21 * 4) =
                 *(float *)((long)pvVar20 + uVar21 * 4) / *(float *)((long)pvVar15 + uVar21 * 4);
            uVar21 = uVar21 + 1;
          } while (uVar14 != uVar21);
          return 0;
        }
        Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if (this_01[1].w != 1) {
          if ((int)uVar3 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          uVar21 = 0;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     fVar29 / *(float *)((long)pvVar15 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar17 != uVar18);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
          } while (uVar21 != uVar19);
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        fVar29 = *this_00->data;
        pvVar15 = this_01->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 / *(float *)((long)pvVar15 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      uVar4 = this_01->c;
      uVar25 = (ulong)uVar4;
      if (this_01[1].dims == 3) {
        if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21) /
                     *(float *)((long)pvVar15 + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01->cstep;
          sVar8 = this_02->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar13 + uVar17 * 4) =
                     *(float *)((long)pvVar20 + uVar17 * 4) / *(float *)((long)pvVar15 + uVar17 * 4)
                ;
                uVar17 = uVar17 + 1;
              } while (uVar14 != uVar17);
            }
            uVar21 = uVar21 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
          } while (uVar21 != uVar25);
          return 0;
        }
        if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_01[1].cstep;
          sVar10 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar20 + uVar18 * 4) /
                     *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17);
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          pvVar20 = this_01[1].data;
          sVar6 = this_01[1].elemsize;
          sVar7 = this_01[1].cstep;
          sVar8 = this_02->elemsize;
          uVar17 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar13 + uVar18 * 4) =
                     *(float *)((long)pvVar20 + uVar18 * 4) / *(float *)((long)pvVar15 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
            pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar24 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         fVar29 / *(float *)((long)pvVar27 + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
                uVar24 = uVar24 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar24 != uVar19);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01[1].cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01->cstep;
          pvVar20 = this_01[1].data;
          uVar18 = 0;
          do {
            if (0 < (int)uVar3) {
              uVar22 = 0;
              pvVar27 = pvVar15;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar12) {
                  uVar24 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar24 * 4) =
                         *(float *)((long)pvVar20 + uVar24 * 4) /
                         *(float *)((long)pvVar27 + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar17 != uVar24);
                }
                uVar22 = uVar22 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
              } while (uVar22 != uVar3);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
            pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
          } while (uVar18 != uVar21);
          return 0;
        }
        if (((uVar12 == 1) && (uVar22 != 1)) && ((uVar1 == uVar3 && (uVar2 == uVar4)))) {
          Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
          pvVar13 = this_02->data;
          if (pvVar13 == (void *)0x0) {
            return -100;
          }
          sVar5 = this_02->cstep;
          if ((long)this_02->c * sVar5 == 0) {
            return -100;
          }
          if ((int)uVar2 < 1) {
            return 0;
          }
          pvVar15 = this_01->data;
          sVar6 = this_01->elemsize;
          pvVar20 = this_01[1].data;
          sVar7 = this_01[1].elemsize;
          sVar8 = this_01->cstep;
          sVar9 = this_02->elemsize;
          sVar10 = this_01[1].cstep;
          uVar17 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              pvVar27 = pvVar20;
              pvVar28 = pvVar13;
              do {
                if (0 < (int)uVar22) {
                  fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                  uVar25 = 0;
                  do {
                    *(float *)((long)pvVar28 + uVar25 * 4) =
                         *(float *)((long)pvVar27 + uVar25 * 4) * (1.0 / fVar29);
                    uVar25 = uVar25 + 1;
                  } while (uVar24 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
                pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
              } while (uVar19 != uVar18);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
            pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
          } while (uVar17 != uVar21);
          return 0;
        }
        if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
          Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
          if (this_02->data == (void *)0x0) {
            return -100;
          }
          if ((long)this_02->c * this_02->cstep == 0) {
            return -100;
          }
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar12 = 0;
          do {
            Mat::channel(&local_88,this_01,uVar12);
            pvVar13 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_00,uVar12);
            pvVar15 = local_88.data;
            Mat::~Mat(&local_88);
            Mat::channel(&local_88,this_02,uVar12);
            pvVar20 = local_88.data;
            Mat::~Mat(&local_88);
            if (0 < (int)uVar14) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar20 + uVar21 * 4) =
                     *(float *)((long)pvVar15 + uVar21 * 4) / *(float *)((long)pvVar13 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar14 != uVar21);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar4);
          return 0;
        }
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar1) {
            uVar11 = 0;
            do {
              if (0 < (int)uVar22) {
                uVar21 = 0;
                do {
                  *(float *)((long)pvVar20 + uVar21 * 4) =
                       *(float *)((long)pvVar15 + uVar21 * 4) /
                       *(float *)((long)pvVar13 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar24 != uVar21);
              }
              uVar11 = uVar11 + 1;
              pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
              pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
            } while (uVar11 != uVar1);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar2);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        iVar23 = this_01[1].w;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar18 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar24 * 4) =
                       fVar29 / *(float *)((long)pvVar27 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar18 = uVar18 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar18 != uVar19);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
        } while (uVar21 != uVar25);
        return 0;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   fVar29 / *(float *)((long)pvVar15 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar29 / *(float *)((long)pvVar15 + uVar17 * 4)
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (uVar12 == 1) {
      iVar23 = this_01[1].dims;
      if (iVar23 == 1) {
        Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar22 < 1) {
          return 0;
        }
        pvVar15 = this_01[1].data;
        fVar29 = *this_01->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) =
               *(float *)((long)pvVar15 + uVar21 * 4) * (1.0 / fVar29);
          uVar21 = uVar21 + 1;
        } while (uVar24 != uVar21);
        return 0;
      }
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        pvVar15 = this_01[1].data;
        fVar29 = *this_01->data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) =
               *(float *)((long)pvVar15 + uVar21 * 4) * (1.0 / fVar29);
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
        return 0;
      }
      if (iVar23 == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        pvVar15 = this_01[1].data;
        sVar8 = this_02->elemsize;
        fVar29 = *this_01->data;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) * (1.0 / fVar29);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
    }
    iVar23 = this_01[1].dims;
    if (iVar23 != 1) {
      if (iVar23 == 2) {
        Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar1 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar22) {
            fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar20 + uVar17 * 4) * (1.0 / fVar29);
              uVar17 = uVar17 + 1;
            } while (uVar24 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
          pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
        } while (uVar21 != uVar18);
        return 0;
      }
      if (iVar23 != 3) {
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 != (void *)0x0) {
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        pvVar20 = this_01[1].data;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar20 + uVar18 * 4) * (1.0 / fVar29);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      return -100;
    }
    Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    if ((long)this_02->c * this_02->cstep == 0) {
      return -100;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar12 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) =
             *(float *)((long)pvVar20 + uVar21 * 4) / *(float *)((long)pvVar15 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
      return 0;
    }
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    uVar21 = 0;
    do {
      *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 / *(float *)((long)pvVar15 + uVar21 * 4);
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    return 0;
  }
  uVar12 = this_01->w;
  lVar16 = (long)(int)uVar12;
  uVar17 = (ulong)uVar12;
  sVar5 = this_01->elemsize;
  uVar22 = this_01[1].w;
  lVar26 = (long)(int)uVar22;
  uVar24 = (ulong)uVar22;
  uVar1 = this_01[1].h;
  uVar18 = (ulong)uVar1;
  uVar2 = this_01[1].c;
  uVar21 = (ulong)uVar2;
  uVar11 = uVar1 * uVar22;
  iVar23 = this_01->dims;
  if (iVar23 != 1) {
    uVar3 = this_01->h;
    uVar19 = (ulong)uVar3;
    uVar14 = uVar3 * uVar12;
    if (iVar23 == 2) {
      if (this_01[1].dims == 3) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        iVar23 = this_01->w;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_02->elemsize;
        sVar9 = this_01[1].cstep;
        pvVar20 = this_01[1].data;
        uVar17 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar19 = 0;
            pvVar27 = pvVar20;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar22) {
                fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + (long)iVar23 * sVar6 * uVar17);
                uVar25 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar25 * 4) =
                       fVar29 - *(float *)((long)pvVar27 + uVar25 * 4);
                  uVar25 = uVar25 + 1;
                } while (uVar24 != uVar25);
              }
              uVar19 = uVar19 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
            } while (uVar19 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
        } while (uVar17 != uVar21);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if (this_01[1].dims != 1) {
        if (this_01[1].dims != 2) {
          return 0;
        }
        if ((int)uVar14 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          *(float *)((long)pvVar13 + uVar21 * 4) =
               *(float *)((long)pvVar15 + uVar21 * 4) - *(float *)((long)pvVar20 + uVar21 * 4);
          uVar21 = uVar21 + 1;
        } while (uVar14 != uVar21);
        return 0;
      }
      Mat::create(this_02,uVar12,uVar3,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if (this_01[1].w != 1) {
        if ((int)uVar3 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        uVar21 = 0;
        do {
          if (0 < (int)uVar12) {
            fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) - fVar29;
              uVar18 = uVar18 + 1;
            } while (uVar17 != uVar18);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
          pvVar15 = (void *)((long)pvVar15 + lVar16 * 4);
        } while (uVar21 != uVar19);
        return 0;
      }
      if ((int)uVar14 < 1) {
        return 0;
      }
      fVar29 = *this_00->data;
      pvVar15 = this_01->data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) - fVar29;
        uVar21 = uVar21 + 1;
      } while (uVar14 != uVar21);
      return 0;
    }
    if (iVar23 != 3) {
      return 0;
    }
    uVar4 = this_01->c;
    uVar25 = (ulong)uVar4;
    if (this_01[1].dims == 3) {
      if (((uVar22 == 1) && (uVar1 == 1)) && (uVar2 == uVar4)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01->cstep;
        sVar9 = this_01[1].cstep;
        sVar10 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) -
                   *(float *)((long)pvVar20 + sVar7 * sVar9 * uVar21);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar8);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((uVar22 == uVar12) && (uVar2 == 1 && uVar1 == uVar3)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01->cstep;
        sVar8 = this_02->elemsize;
        uVar21 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar17 = 0;
            do {
              *(float *)((long)pvVar13 + uVar17 * 4) =
                   *(float *)((long)pvVar15 + uVar17 * 4) - *(float *)((long)pvVar20 + uVar17 * 4);
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar21 = uVar21 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
        } while (uVar21 != uVar25);
        return 0;
      }
      if ((uVar12 == 1) && ((uVar3 == 1 && (uVar2 == uVar4)))) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        pvVar20 = this_01[1].data;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01->cstep;
        sVar9 = this_01[1].cstep;
        sVar10 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + sVar6 * sVar8 * uVar17) -
                   *(float *)((long)pvVar20 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar10);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar9);
        } while (uVar17 != uVar21);
        return 0;
      }
      if ((uVar22 == uVar12) && (uVar4 == 1 && uVar3 == uVar1)) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        pvVar20 = this_01[1].data;
        sVar6 = this_01[1].elemsize;
        sVar7 = this_01[1].cstep;
        sVar8 = this_02->elemsize;
        uVar17 = 0;
        do {
          if (0 < (int)uVar11) {
            uVar18 = 0;
            do {
              *(float *)((long)pvVar13 + uVar18 * 4) =
                   *(float *)((long)pvVar15 + uVar18 * 4) - *(float *)((long)pvVar20 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
          pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
        } while (uVar17 != uVar21);
        return 0;
      }
      if ((((uVar12 != 1) && (uVar22 == 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01[1].cstep;
        sVar9 = this_02->elemsize;
        sVar10 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar18 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar24 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                fVar29 = *(float *)((long)pvVar20 + uVar24 * 4 + sVar7 * sVar8 * uVar18);
                uVar25 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar25 * 4) =
                       *(float *)((long)pvVar27 + uVar25 * 4) - fVar29;
                  uVar25 = uVar25 + 1;
                } while (uVar17 != uVar25);
              }
              uVar24 = uVar24 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar24 != uVar19);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
        } while (uVar18 != uVar21);
        return 0;
      }
      if (((uVar22 == uVar12) && (uVar3 != 1)) && ((uVar1 == 1 && (uVar2 == uVar4)))) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01[1].cstep;
        sVar9 = this_02->elemsize;
        sVar10 = this_01->cstep;
        pvVar20 = this_01[1].data;
        uVar18 = 0;
        do {
          if (0 < (int)uVar3) {
            uVar22 = 0;
            pvVar27 = pvVar15;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar12) {
                uVar24 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar24 * 4) =
                       *(float *)((long)pvVar27 + uVar24 * 4) -
                       *(float *)((long)pvVar20 + uVar24 * 4);
                  uVar24 = uVar24 + 1;
                } while (uVar17 != uVar24);
              }
              uVar22 = uVar22 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
            } while (uVar22 != uVar3);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar8);
          pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar10);
        } while (uVar18 != uVar21);
        return 0;
      }
      if ((((uVar12 == 1) && (uVar22 != 1)) && (uVar1 == uVar3)) && (uVar2 == uVar4)) {
        Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
        pvVar13 = this_02->data;
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        sVar5 = this_02->cstep;
        if ((long)this_02->c * sVar5 == 0) {
          return -100;
        }
        if ((int)uVar2 < 1) {
          return 0;
        }
        pvVar15 = this_01->data;
        sVar6 = this_01->elemsize;
        sVar7 = this_01[1].elemsize;
        sVar8 = this_01->cstep;
        sVar9 = this_02->elemsize;
        sVar10 = this_01[1].cstep;
        pvVar20 = this_01[1].data;
        uVar17 = 0;
        do {
          if (0 < (int)uVar1) {
            uVar19 = 0;
            pvVar27 = pvVar20;
            pvVar28 = pvVar13;
            do {
              if (0 < (int)uVar22) {
                fVar29 = *(float *)((long)pvVar15 + uVar19 * 4 + sVar6 * sVar8 * uVar17);
                uVar25 = 0;
                do {
                  *(float *)((long)pvVar28 + uVar25 * 4) =
                       fVar29 - *(float *)((long)pvVar27 + uVar25 * 4);
                  uVar25 = uVar25 + 1;
                } while (uVar24 != uVar25);
              }
              uVar19 = uVar19 + 1;
              pvVar28 = (void *)((long)pvVar28 + lVar26 * 4);
              pvVar27 = (void *)((long)pvVar27 + lVar26 * 4);
            } while (uVar19 != uVar18);
          }
          uVar17 = uVar17 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar9);
          pvVar20 = (void *)((long)pvVar20 + sVar7 * sVar10);
        } while (uVar17 != uVar21);
        return 0;
      }
      if ((((uVar22 != uVar12) || (uVar1 == 1)) || (uVar3 != 1)) || (uVar2 != uVar4)) {
        Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
        if (this_02->data == (void *)0x0) {
          return -100;
        }
        if ((long)this_02->c * this_02->cstep == 0) {
          return -100;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        uVar12 = 0;
        do {
          Mat::channel(&local_88,this_01,uVar12);
          pvVar13 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_00,uVar12);
          pvVar15 = local_88.data;
          Mat::~Mat(&local_88);
          Mat::channel(&local_88,this_02,uVar12);
          pvVar20 = local_88.data;
          Mat::~Mat(&local_88);
          if (0 < (int)uVar14) {
            uVar21 = 0;
            do {
              *(float *)((long)pvVar20 + uVar21 * 4) =
                   *(float *)((long)pvVar13 + uVar21 * 4) - *(float *)((long)pvVar15 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar14 != uVar21);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar4);
        return 0;
      }
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      if (this_02->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar2 < 1) {
        return 0;
      }
      uVar12 = 0;
      do {
        Mat::channel(&local_88,this_01,uVar12);
        pvVar13 = local_88.data;
        Mat::~Mat(&local_88);
        Mat::channel(&local_88,this_00,uVar12);
        pvVar15 = local_88.data;
        Mat::~Mat(&local_88);
        Mat::channel(&local_88,this_02,uVar12);
        pvVar20 = local_88.data;
        Mat::~Mat(&local_88);
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            if (0 < (int)uVar22) {
              uVar21 = 0;
              do {
                *(float *)((long)pvVar20 + uVar21 * 4) =
                     *(float *)((long)pvVar13 + uVar21 * 4) - *(float *)((long)pvVar15 + uVar21 * 4)
                ;
                uVar21 = uVar21 + 1;
              } while (uVar24 != uVar21);
            }
            uVar11 = uVar11 + 1;
            pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
            pvVar15 = (void *)((long)pvVar15 + lVar26 * 4);
          } while (uVar11 != uVar1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar2);
      return 0;
    }
    Mat::create(this_02,uVar12,uVar3,uVar4,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar5 = this_02->cstep;
    if ((long)this_02->c * sVar5 == 0) {
      return -100;
    }
    if (this_01[1].dims != 1) {
      if (this_01[1].dims != 2) {
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      iVar23 = this_01[1].w;
      sVar7 = this_01[1].elemsize;
      sVar8 = this_02->elemsize;
      sVar9 = this_01->cstep;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar18 = 0;
          pvVar27 = pvVar15;
          pvVar28 = pvVar13;
          do {
            if (0 < (int)uVar12) {
              fVar29 = *(float *)((long)pvVar20 + uVar18 * 4 + (long)iVar23 * sVar7 * uVar21);
              uVar24 = 0;
              do {
                *(float *)((long)pvVar28 + uVar24 * 4) =
                     *(float *)((long)pvVar27 + uVar24 * 4) - fVar29;
                uVar24 = uVar24 + 1;
              } while (uVar17 != uVar24);
            }
            uVar18 = uVar18 + 1;
            pvVar28 = (void *)((long)pvVar28 + lVar16 * 4);
            pvVar27 = (void *)((long)pvVar27 + lVar16 * 4);
          } while (uVar18 != uVar19);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar9);
      } while (uVar21 != uVar25);
      return 0;
    }
    if (this_01[1].w != 1) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      sVar6 = this_01->elemsize;
      pvVar20 = this_01[1].data;
      sVar7 = this_01->cstep;
      sVar8 = this_02->elemsize;
      uVar21 = 0;
      do {
        if (0 < (int)uVar14) {
          fVar29 = *(float *)((long)pvVar20 + uVar21 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) - fVar29
            ;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar21 != uVar25);
      return 0;
    }
    if ((int)uVar4 < 1) {
      return 0;
    }
    fVar29 = *this_00->data;
    pvVar15 = this_01->data;
    sVar6 = this_01->elemsize;
    sVar7 = this_01->cstep;
    sVar8 = this_02->elemsize;
    uVar21 = 0;
    do {
      if (0 < (int)uVar14) {
        uVar17 = 0;
        do {
          *(float *)((long)pvVar13 + uVar17 * 4) = *(float *)((long)pvVar15 + uVar17 * 4) - fVar29;
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
      }
      uVar21 = uVar21 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
      pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
    } while (uVar21 != uVar25);
    return 0;
  }
  if (uVar12 == 1) {
    iVar23 = this_01[1].dims;
    if (iVar23 == 1) {
      Mat::create(this_02,uVar22,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar22 < 1) {
        return 0;
      }
      fVar29 = *this_01->data;
      pvVar15 = this_00->data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 - *(float *)((long)pvVar15 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar24 != uVar21);
      return 0;
    }
    if (iVar23 == 2) {
      Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar11 < 1) {
        return 0;
      }
      fVar29 = *this_01->data;
      pvVar15 = this_00->data;
      uVar21 = 0;
      do {
        *(float *)((long)pvVar13 + uVar21 * 4) = fVar29 - *(float *)((long)pvVar15 + uVar21 * 4);
        uVar21 = uVar21 + 1;
      } while (uVar11 != uVar21);
      return 0;
    }
    if (iVar23 == 3) {
      Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      sVar5 = this_02->cstep;
      if ((long)this_02->c * sVar5 == 0) {
        return -100;
      }
      if ((int)uVar2 < 1) {
        return 0;
      }
      fVar29 = *this_01->data;
      pvVar15 = this_01[1].data;
      sVar6 = this_01[1].elemsize;
      sVar7 = this_01[1].cstep;
      sVar8 = this_02->elemsize;
      uVar17 = 0;
      do {
        if (0 < (int)uVar11) {
          uVar18 = 0;
          do {
            *(float *)((long)pvVar13 + uVar18 * 4) = fVar29 - *(float *)((long)pvVar15 + uVar18 * 4)
            ;
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
        }
        uVar17 = uVar17 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
        pvVar15 = (void *)((long)pvVar15 + sVar6 * sVar7);
      } while (uVar17 != uVar21);
      return 0;
    }
  }
  iVar23 = this_01[1].dims;
  if (iVar23 != 1) {
    if (iVar23 == 2) {
      Mat::create(this_02,uVar22,uVar1,sVar5,opt->blob_allocator);
      pvVar13 = this_02->data;
      if (pvVar13 == (void *)0x0) {
        return -100;
      }
      if ((long)this_02->c * this_02->cstep == 0) {
        return -100;
      }
      if ((int)uVar1 < 1) {
        return 0;
      }
      pvVar15 = this_01->data;
      pvVar20 = this_01[1].data;
      uVar21 = 0;
      do {
        if (0 < (int)uVar22) {
          fVar29 = *(float *)((long)pvVar15 + uVar21 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar29 - *(float *)((long)pvVar20 + uVar17 * 4)
            ;
            uVar17 = uVar17 + 1;
          } while (uVar24 != uVar17);
        }
        uVar21 = uVar21 + 1;
        pvVar13 = (void *)((long)pvVar13 + lVar26 * 4);
        pvVar20 = (void *)((long)pvVar20 + lVar26 * 4);
      } while (uVar21 != uVar18);
      return 0;
    }
    if (iVar23 != 3) {
      return 0;
    }
    Mat::create(this_02,uVar22,uVar1,uVar2,sVar5,opt->blob_allocator);
    pvVar13 = this_02->data;
    if (pvVar13 == (void *)0x0) {
      return -100;
    }
    sVar5 = this_02->cstep;
    if ((long)this_02->c * sVar5 == 0) {
      return -100;
    }
    if ((int)uVar2 < 1) {
      return 0;
    }
    pvVar15 = this_01->data;
    pvVar20 = this_01[1].data;
    sVar6 = this_01[1].elemsize;
    sVar7 = this_01[1].cstep;
    sVar8 = this_02->elemsize;
    uVar17 = 0;
    do {
      if (0 < (int)uVar11) {
        fVar29 = *(float *)((long)pvVar15 + uVar17 * 4);
        uVar18 = 0;
        do {
          *(float *)((long)pvVar13 + uVar18 * 4) = fVar29 - *(float *)((long)pvVar20 + uVar18 * 4);
          uVar18 = uVar18 + 1;
        } while (uVar11 != uVar18);
      }
      uVar17 = uVar17 + 1;
      pvVar13 = (void *)((long)pvVar13 + sVar5 * sVar8);
      pvVar20 = (void *)((long)pvVar20 + sVar6 * sVar7);
    } while (uVar17 != uVar21);
    return 0;
  }
  Mat::create(this_02,uVar12,sVar5,opt->blob_allocator);
  pvVar13 = this_02->data;
  if (pvVar13 == (void *)0x0) {
    return -100;
  }
  if ((long)this_02->c * this_02->cstep == 0) {
    return -100;
  }
  if (this_01[1].w != 1) {
    if ((int)uVar12 < 1) {
      return 0;
    }
    pvVar15 = this_01->data;
    pvVar20 = this_01[1].data;
    uVar21 = 0;
    do {
      *(float *)((long)pvVar13 + uVar21 * 4) =
           *(float *)((long)pvVar15 + uVar21 * 4) - *(float *)((long)pvVar20 + uVar21 * 4);
      uVar21 = uVar21 + 1;
    } while (uVar17 != uVar21);
    return 0;
  }
  if ((int)uVar12 < 1) {
    return 0;
  }
  fVar29 = *this_00->data;
  pvVar15 = this_01->data;
  uVar21 = 0;
  do {
    *(float *)((long)pvVar13 + uVar21 * 4) = *(float *)((long)pvVar15 + uVar21 * 4) - fVar29;
    uVar21 = uVar21 + 1;
  } while (uVar17 != uVar21);
  return 0;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& bottom_blob1 = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];

    if (op_type == Operation_ADD)
        return binary_op<binary_op_add>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_SUB)
        return binary_op<binary_op_sub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MUL)
        return binary_op<binary_op_mul>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_DIV)
        return binary_op<binary_op_div>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MAX)
        return binary_op<binary_op_max>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_MIN)
        return binary_op<binary_op_min>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_POW)
        return binary_op<binary_op_pow>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RSUB)
        return binary_op<binary_op_rsub>(bottom_blob, bottom_blob1, top_blob, opt);

    if (op_type == Operation_RDIV)
        return binary_op<binary_op_rdiv>(bottom_blob, bottom_blob1, top_blob, opt);

    return 0;
}